

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall
QMenuSloppyState::setSubMenuPopup
          (QMenuSloppyState *this,QRect *actionRect,QAction *resetAction,QMenu *subMenu)

{
  long lVar1;
  bool bVar2;
  QMenuPrivate *pQVar3;
  QRect *in_RCX;
  QRectF *in_RDX;
  QMenuSloppyState *in_RDI;
  long in_FS_OFFSET;
  QMenu *in_stack_ffffffffffffffa8;
  qreal local_28;
  qreal local_20;
  qreal local_18;
  qreal local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->field_0x6c = in_RDI->field_0x6c & 0xfe | 1;
  in_RDI->m_init_guard = true;
  in_RDI->field_0x6c = in_RDI->field_0x6c & 0xdf | 0x20;
  QBasicTimer::stop();
  QRectF::QRectF(in_RDX,in_RCX);
  (in_RDI->m_action_rect).xp = local_28;
  (in_RDI->m_action_rect).yp = local_20;
  (in_RDI->m_action_rect).w = local_18;
  (in_RDI->m_action_rect).h = local_10;
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QMenu> *)0x642906);
  if (bVar2) {
    ::QPointer::operator_cast_to_QMenu_((QPointer<QMenu> *)0x64291a);
    pQVar3 = QMenuPrivate::get((QMenu *)0x642922);
    (pQVar3->sloppyState).m_parent = (QMenuSloppyState *)0x0;
  }
  QPointer<QMenu>::operator=((QPointer<QMenu> *)in_RDI,in_stack_ffffffffffffffa8);
  pQVar3 = QMenuPrivate::get((QMenu *)0x64294a);
  (pQVar3->sloppyState).m_parent = in_RDI;
  in_RDI->m_reset_action = (QAction *)in_RDX;
  in_RDI->m_origin_action = (QAction *)in_RDX;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuSloppyState::setSubMenuPopup(const QRect &actionRect, QAction *resetAction, QMenu *subMenu)
{
    m_enabled = true;
    m_init_guard = true;
    m_use_reset_action = true;
    m_time.stop();
    m_action_rect = actionRect;
    if (m_sub_menu)
        QMenuPrivate::get(m_sub_menu)->sloppyState.m_parent = nullptr;
    m_sub_menu = subMenu;
    QMenuPrivate::get(subMenu)->sloppyState.m_parent = this;
    m_reset_action = resetAction;
    m_origin_action = resetAction;
}